

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::ftranL(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  const_reference pvVar8;
  HighsInt *in_RDX;
  int iVar9;
  HVector *in_RSI;
  long in_RDI;
  double *in_XMM0_Qa;
  double dVar10;
  double *l_value_1;
  HighsInt *l_index_1;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double pivot_multiplier;
  HighsInt pivotRow;
  HighsInt i;
  HighsInt rhs_count;
  double *l_value;
  HighsInt *l_index;
  HighsInt *l_start;
  double *rhs_array;
  HighsInt *rhs_index;
  bool sparse_solve;
  double current_density;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  HighsInt HVar11;
  HVectorBase<double> *in_stack_ffffffffffffff30;
  HVectorBase<double> *in_stack_ffffffffffffff50;
  bool local_a1;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_68;
  int local_64;
  HighsInt *in_stack_ffffffffffffffa8;
  HighsInt *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  HighsInt *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  
  FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,
                     (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20)
  ;
  if (*(int *)(in_RDI + 0x198) == 4) {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,
                       (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                       in_stack_ffffffffffffff20);
    HVectorBase<double>::tight(in_stack_ffffffffffffff50);
    HVectorBase<double>::pack(in_stack_ffffffffffffff30);
    ftranAPF((HFactor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (HVector *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,
                      (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),in_stack_ffffffffffffff20
                     );
    HVectorBase<double>::tight(in_stack_ffffffffffffff50);
  }
  dVar10 = (double)in_RSI->count * 1.0 * *(double *)(in_RDI + 0xd8);
  local_a1 = true;
  if ((-1 < in_RSI->count) && (local_a1 = true, dVar10 <= 0.05)) {
    local_a1 = 0.15 < (double)in_XMM0_Qa;
  }
  HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if (local_a1 == false) {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
    HVar11 = (HighsInt)((ulong)dVar10 >> 0x20);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf1fc);
    in_stack_ffffffffffffff20 =
         (HighsTimerClock *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x7cf212);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf232);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf248);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7cf25e);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x498),1);
    solveHyper(HVar11,(HighsInt *)CONCAT17(local_a1,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_RDX,in_XMM0_Qa,in_RSI);
    HVar11 = (HighsInt)((ulong)in_RSI >> 0x20);
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  }
  else {
    FactorTimer::start((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
    piVar3 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cefac);
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7cefc5);
    piVar5 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cefde);
    piVar6 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7ceff7);
    pdVar7 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7cf010);
    local_64 = 0;
    for (local_68 = 0; HVar11 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20),
        local_68 < *(int *)(in_RDI + 200); local_68 = local_68 + 1) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x480),(long)local_68);
      iVar2 = *pvVar8;
      dVar10 = pdVar4[iVar2];
      if (ABS(dVar10) <= 1e-14) {
        pdVar4[iVar2] = 0.0;
      }
      else {
        iVar9 = local_64 + 1;
        piVar3[local_64] = iVar2;
        iVar1 = piVar5[local_68 + 1];
        for (iVar2 = piVar5[local_68]; local_64 = iVar9, iVar2 < iVar1; iVar2 = iVar2 + 1) {
          pdVar4[piVar6[iVar2]] = -dVar10 * pdVar7[iVar2] + pdVar4[piVar6[iVar2]];
        }
      }
    }
    in_RSI->count = local_64;
    FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  }
  FactorTimer::stop((FactorTimer *)in_stack_ffffffffffffff30,HVar11,in_stack_ffffffffffffff20);
  return;
}

Assistant:

void HFactor::ftranL(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorFtranLower, factor_timer_clock_pointer);
  if (update_method == kUpdateMethodApf) {
    assert(!(update_method == kUpdateMethodApf));
    factor_timer.start(FactorFtranLowerAPF, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    ftranAPF(rhs);
    factor_timer.stop(FactorFtranLowerAPF, factor_timer_clock_pointer);
    rhs.tight();
  }

  // Determine style of solve
  double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperFtranL;
  if (sparse_solve) {
    factor_timer.start(FactorFtranLowerSps, factor_timer_clock_pointer);
    // Alias to RHS
    HighsInt* rhs_index = rhs.index.data();
    double* rhs_array = rhs.array.data();
    // Alias to factor L
    const HighsInt* l_start = this->l_start.data();
    const HighsInt* l_index = this->l_index.data();
    const double* l_value = this->l_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    for (HighsInt i = 0; i < num_row; i++) {
      HighsInt pivotRow = l_pivot_index[i];
      const double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        rhs_index[rhs_count++] = pivotRow;
        const HighsInt start = l_start[i];
        const HighsInt end = l_start[i + 1];
        for (HighsInt k = start; k < end; k++)
          rhs_array[l_index[k]] -= pivot_multiplier * l_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    factor_timer.stop(FactorFtranLowerSps, factor_timer_clock_pointer);
  } else {
    // Hyper-sparse solve
    factor_timer.start(FactorFtranLowerHyper, factor_timer_clock_pointer);
    const HighsInt* l_index = this->l_index.data();
    const double* l_value = this->l_value.data();
    solveHyper(num_row, l_pivot_lookup.data(), l_pivot_index.data(), 0,
               l_start.data(), &l_start[1], &l_index[0], &l_value[0], &rhs);
    factor_timer.stop(FactorFtranLowerHyper, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorFtranLower, factor_timer_clock_pointer);
}